

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentUniformTexelBuffer::~RenderFragmentUniformTexelBuffer
          (RenderFragmentUniformTexelBuffer *this)

{
  pointer pHVar1;
  VkDescriptorPool obj;
  VkPipelineLayout obj_00;
  VkDescriptorSetLayout obj_01;
  VkPipeline obj_02;
  pointer pHVar2;
  ulong uVar3;
  
  (this->super_RenderPassCommand)._vptr_RenderPassCommand =
       (_func_int **)&PTR__RenderFragmentUniformTexelBuffer_00d27bd8;
  pHVar2 = (this->m_bufferViews).
           super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_bufferViews).
      super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar2) {
    uVar3 = 0;
    do {
      if (pHVar2[uVar3].m_internal != 0) {
        (*this->m_vkd->_vptr_DeviceInterface[0x24])
                  (this->m_vkd,this->m_device,pHVar2[uVar3].m_internal,0);
        (this->m_bufferViews).
        super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar3].m_internal = 0;
      }
      uVar3 = uVar3 + 1;
      pHVar2 = (this->m_bufferViews).
               super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->m_bufferViews).
                                   super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar2 >> 3));
  }
  if (pHVar2 != (pointer)0x0) {
    operator_delete(pHVar2,(long)(this->m_bufferViews).
                                 super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar2);
  }
  pHVar1 = (this->m_descriptorSets).
           super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pHVar1 != (pointer)0x0) {
    operator_delete(pHVar1,(long)(this->m_descriptorSets).
                                 super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar1);
  }
  obj.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj);
  }
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_00.m_internal =
       (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
       object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                m_data.deleter,obj_00);
  }
  (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
  m_internal = 0;
  (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_01.m_internal =
       (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
       .object.m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_resources).descriptorSetLayout.
                super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,obj_01);
  }
  (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
  deleter.m_device = (VkDevice)0x0;
  (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
  deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
  object.m_internal = 0;
  (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
  deleter.m_deviceIface = (DeviceInterface *)0x0;
  obj_02.m_internal =
       (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
       m_internal;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                deleter,obj_02);
  }
  (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
  m_internal = 0;
  (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  return;
}

Assistant:

RenderFragmentUniformTexelBuffer::~RenderFragmentUniformTexelBuffer (void)
{
	for (size_t bufferViewNdx = 0; bufferViewNdx < m_bufferViews.size(); bufferViewNdx++)
	{
		if (!!m_bufferViews[bufferViewNdx])
		{
			m_vkd->destroyBufferView(m_device, m_bufferViews[bufferViewNdx], DE_NULL);
			m_bufferViews[bufferViewNdx] = (vk::VkBufferView)0;
		}
	}
}